

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRDetector.cpp
# Opt level: O2

RegressionLine *
ZXing::QRCode::TraceLine
          (RegressionLine *__return_storage_ptr__,BitMatrix *image,PointF p,PointF d,int edge)

{
  Direction dir;
  undefined1 auVar1 [16];
  bool bVar2;
  Value VVar3;
  PointT<int> PVar4;
  long lVar5;
  int iVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  PointF PVar12;
  double dVar13;
  BitMatrixCursor<ZXing::PointT<int>_> local_b8;
  Direction local_a0;
  int iStack_9c;
  BitMatrixCursorI c;
  BitMatrixCursor<ZXing::PointT<double>_> local_80;
  PointT<double> local_58;
  PointF local_48;
  
  local_80.p.x = p.x;
  local_80.p.y = p.y;
  auVar10._0_8_ = d.x - local_80.p.x;
  auVar10._8_8_ = d.y - local_80.p.y;
  dVar7 = ABS(auVar10._8_8_);
  if (ABS(auVar10._8_8_) <= ABS(auVar10._0_8_)) {
    dVar7 = ABS(auVar10._0_8_);
  }
  auVar1._8_4_ = SUB84(dVar7,0);
  auVar1._0_8_ = dVar7;
  auVar1._12_4_ = (int)((ulong)dVar7 >> 0x20);
  local_80.d = (PointT<double>)divpd(auVar10,auVar1);
  local_80.img = image;
  local_58 = local_80.d;
  local_48 = p;
  RegressionLine::RegressionLine(__return_storage_ptr__);
  auVar8._0_8_ = SQRT(local_58.x * local_58.x + local_58.y * local_58.y);
  auVar11._0_8_ = -local_58.x;
  auVar11._8_8_ = -local_58.y;
  auVar8._8_8_ = auVar8._0_8_;
  PVar12 = (PointF)divpd(auVar11,auVar8);
  __return_storage_ptr__->_directionInward = PVar12;
  BitMatrixCursor<ZXing::PointT<double>_>::stepToEdge(&local_80,edge,0,edge == 3);
  dVar7 = local_80.d.x;
  dVar9 = local_80.d.y;
  if (edge == 3) {
    dVar7 = -local_80.d.x;
    dVar9 = -local_80.d.y;
    local_80.d.y = dVar9;
    local_80.d.x = dVar7;
  }
  dVar13 = ABS(dVar7);
  if (dVar13 <= ABS(dVar9)) {
    dVar7 = 0.0;
  }
  local_b8.p.x = (int)local_80.p.x;
  local_b8.p.y = (int)local_80.p.y;
  _local_a0 = CONCAT44((int)(double)(~-(ulong)(ABS(dVar9) < dVar13) & (ulong)dVar9),(int)dVar7);
  local_b8.img = image;
LAB_00190f6c:
  do {
    VVar3 = BitMatrixCursor<ZXing::PointT<int>_>::edgeAtBack(&local_b8);
    if (VVar3.v != -1) {
      _local_a0 = 0x1ffffffff;
      lVar5 = 0;
      do {
        if (lVar5 == 8) {
          RegressionLine::evaluate(__return_storage_ptr__,1.0,true);
          return __return_storage_ptr__;
        }
        dir = *(Direction *)((long)&local_a0 + lVar5);
        c.d.x = -(local_b8.d.y * dir);
        c.d.y = local_b8.d.x * dir;
        c.p = local_b8.p;
        dVar7 = ABS(local_80.p.y - local_48.y);
        if (ABS(local_80.p.y - local_48.y) <= ABS(local_80.p.x - local_48.x)) {
          dVar7 = ABS(local_80.p.x - local_48.x);
        }
        iVar6 = (int)dVar7 + 1;
        c.img = image;
        do {
          PVar12.x = (double)c.p.x + 0.5;
          PVar12.y = (double)c.p.y + 0.5;
          RegressionLine::add(__return_storage_ptr__,PVar12);
          iVar6 = iVar6 + -1;
          if (iVar6 < 2) break;
          bVar2 = BitMatrixCursor<ZXing::PointT<int>_>::stepAlongEdge(&c,dir,true);
        } while (bVar2);
        lVar5 = lVar5 + 4;
      } while( true );
    }
    VVar3 = BitMatrixCursor<ZXing::PointT<int>_>::edgeAtLeft(&local_b8);
    if (VVar3.v != -1) {
      local_b8.d.y = -local_b8.d.y;
LAB_00190fa9:
      PVar4.y = local_b8.d.x;
      PVar4.x = local_b8.d.y;
      local_b8.d = PVar4;
      goto LAB_00190f6c;
    }
    VVar3 = BitMatrixCursor<ZXing::PointT<int>_>::edgeAtRight(&local_b8);
    if (VVar3.v != -1) {
      local_b8.d.x = -local_b8.d.x;
      goto LAB_00190fa9;
    }
    BitMatrixCursor<ZXing::PointT<int>_>::step(&local_b8,-1);
  } while( true );
}

Assistant:

static RegressionLine TraceLine(const BitMatrix& image, PointF p, PointF d, int edge)
{
	BitMatrixCursorF cur(image, p, d - p);
	RegressionLine line;
	line.setDirectionInward(cur.back());

	// collect points inside the black line -> backup on 3rd edge
	cur.stepToEdge(edge, 0, edge == 3);
	if (edge == 3)
		cur.turnBack();

	auto curI = BitMatrixCursorI(image, PointI(cur.p), PointI(mainDirection(cur.d)));
	// make sure curI positioned such that the white->black edge is directly behind
	// Test image: fix-traceline.jpg
	while (!curI.edgeAtBack()) {
		if (curI.edgeAtLeft())
			curI.turnRight();
		else if (curI.edgeAtRight())
			curI.turnLeft();
		else
			curI.step(-1);
	}

	for (auto dir : {Direction::LEFT, Direction::RIGHT}) {
		auto c = BitMatrixCursorI(image, curI.p, curI.direction(dir));
		auto stepCount = static_cast<int>(maxAbsComponent(cur.p - p));
		do {
			line.add(centered(c.p));
		} while (--stepCount > 0 && c.stepAlongEdge(dir, true));
	}

	line.evaluate(1.0, true);

	for (auto p : line.points())
		log(p, 2);

	return line;
}